

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_cmpi_16_pcdi(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint res;
  uint dst;
  uint src;
  
  if ((m68ki_cpu.cpu_type & 0x3fc) == 0) {
    m68ki_exception_illegal();
  }
  else {
    uVar1 = m68ki_read_imm_16();
    uVar2 = OPER_PCDI_16();
    uVar3 = uVar2 - uVar1;
    m68ki_cpu.n_flag = uVar3 >> 8;
    m68ki_cpu.not_z_flag = uVar3 & 0xffff;
    m68ki_cpu.v_flag = ((uVar1 ^ uVar2) & (uVar3 ^ uVar2)) >> 8;
    m68ki_cpu.c_flag = uVar3 >> 8;
  }
  return;
}

Assistant:

static void m68k_op_cmpi_16_pcdi(void)
{
	if(CPU_TYPE_IS_010_PLUS(CPU_TYPE))
    // if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint src = OPER_I_16();
		uint dst = OPER_PCDI_16();
		uint res = dst - src;

		FLAG_N = NFLAG_16(res);
		FLAG_Z = MASK_OUT_ABOVE_16(res);
		FLAG_V = VFLAG_SUB_16(src, dst, res);
		FLAG_C = CFLAG_16(res);
		return;
	}
	m68ki_exception_illegal();
}